

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3tokColumnMethod(sqlite3_vtab_cursor *pCursor,sqlite3_context *pCtx,int iCol)

{
  Fts3tokCursor *pCsr;
  int iCol_local;
  sqlite3_context *pCtx_local;
  sqlite3_vtab_cursor *pCursor_local;
  
  switch(iCol) {
  case 0:
    sqlite3_result_text(pCtx,(char *)pCursor[1].pVtab,-1,(_func_void_void_ptr *)0xffffffffffffffff);
    break;
  case 1:
    sqlite3_result_text(pCtx,(char *)pCursor[4].pVtab,*(int *)&pCursor[5].pVtab,
                        (_func_void_void_ptr *)0xffffffffffffffff);
    break;
  case 2:
    sqlite3_result_int(pCtx,*(int *)((long)&pCursor[5].pVtab + 4));
    break;
  case 3:
    sqlite3_result_int(pCtx,*(int *)&pCursor[6].pVtab);
    break;
  default:
    sqlite3_result_int(pCtx,*(int *)((long)&pCursor[6].pVtab + 4));
  }
  return 0;
}

Assistant:

static int fts3tokColumnMethod(
  sqlite3_vtab_cursor *pCursor,   /* Cursor to retrieve value from */
  sqlite3_context *pCtx,          /* Context for sqlite3_result_xxx() calls */
  int iCol                        /* Index of column to read value from */
){
  Fts3tokCursor *pCsr = (Fts3tokCursor *)pCursor;

  /* CREATE TABLE x(input, token, start, end, position) */
  switch( iCol ){
    case 0:
      sqlite3_result_text(pCtx, pCsr->zInput, -1, SQLITE_TRANSIENT);
      break;
    case 1:
      sqlite3_result_text(pCtx, pCsr->zToken, pCsr->nToken, SQLITE_TRANSIENT);
      break;
    case 2:
      sqlite3_result_int(pCtx, pCsr->iStart);
      break;
    case 3:
      sqlite3_result_int(pCtx, pCsr->iEnd);
      break;
    default:
      assert( iCol==4 );
      sqlite3_result_int(pCtx, pCsr->iPos);
      break;
  }
  return SQLITE_OK;
}